

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isprint.c
# Opt level: O0

int main(void)

{
  int iVar1;
  
  iVar1 = isprint(0x61);
  if (iVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1b,"isprint( \'a\' )");
  }
  iVar1 = isprint(0x7a);
  if (iVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1c,"isprint( \'z\' )");
  }
  iVar1 = isprint(0x41);
  if (iVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1d,"isprint( \'A\' )");
  }
  iVar1 = isprint(0x5a);
  if (iVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1e,"isprint( \'Z\' )");
  }
  iVar1 = isprint(0x40);
  if (iVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1f,"isprint( \'@\' )");
  }
  iVar1 = isprint(9);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x20,"! isprint( \'\\t\' )");
  }
  iVar1 = isprint(0);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x21,"! isprint( \'\\0\' )");
  }
  iVar1 = isprint(0x20);
  if (iVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x22,"isprint( \' \' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( isprint( 'a' ) );
    TESTCASE( isprint( 'z' ) );
    TESTCASE( isprint( 'A' ) );
    TESTCASE( isprint( 'Z' ) );
    TESTCASE( isprint( '@' ) );
    TESTCASE( ! isprint( '\t' ) );
    TESTCASE( ! isprint( '\0' ) );
    TESTCASE( isprint( ' ' ) );
    return TEST_RESULTS;
}